

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderView::mouseDoubleClickEvent(QHeaderView *this,QMouseEvent *e)

{
  int iVar1;
  int iVar2;
  ResizeMode RVar3;
  int iVar4;
  QHeaderViewPrivate *pQVar5;
  QHeaderViewPrivate *in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  CursorShape splitCursor;
  int handle;
  int pos;
  QHeaderViewPrivate *d;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int position;
  QCursor local_48;
  QCursor local_40;
  QPointF local_38;
  QPoint local_28;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QHeaderView *)0x83e775);
  if (pQVar5->orientation == Horizontal) {
    local_20 = QSinglePointEvent::position((QSinglePointEvent *)0x83e792);
    local_10 = QPointF::toPoint(in_RDI);
    iVar1 = QPoint::x((QPoint *)0x83e7c6);
  }
  else {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)0x83e7d6);
    local_28 = QPointF::toPoint(in_RDI);
    iVar1 = QPoint::y((QPoint *)0x83e801);
  }
  iVar2 = QHeaderViewPrivate::sectionHandleAt(in_RSI,(int)((ulong)pQVar5 >> 0x20));
  if ((iVar2 < 0) ||
     (RVar3 = sectionResizeMode((QHeaderView *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                (int)((ulong)in_RDI >> 0x20)), RVar3 != Interactive)) {
    QSinglePointEvent::position((QSinglePointEvent *)0x83e908);
    QPointF::toPoint(in_RDI);
    logicalIndexAt((QHeaderView *)in_RDI,(QPoint *)CONCAT44(iVar1,in_stack_ffffffffffffff68));
    sectionDoubleClicked((QHeaderView *)0x83e93e,in_stack_ffffffffffffff5c);
  }
  else {
    sectionHandleDoubleClicked((QHeaderView *)0x83e84f,in_stack_ffffffffffffff5c);
    iVar1 = 0xb;
    if (pQVar5->orientation == Horizontal) {
      iVar1 = 0xc;
    }
    QWidget::cursor((QWidget *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
    position = (int)((ulong)pQVar5 >> 0x20);
    iVar4 = QCursor::shape();
    iVar2 = iVar1;
    QCursor::~QCursor(&local_40);
    if ((iVar4 == iVar1) &&
       ((iVar1 = QHeaderViewPrivate::sectionHandleAt(in_RSI,position), iVar1 < 0 ||
        (RVar3 = sectionResizeMode((QHeaderView *)CONCAT44(iVar2,in_stack_ffffffffffffff78),
                                   (int)((ulong)in_RDI >> 0x20)), RVar3 != Interactive)))) {
      QCursor::QCursor(&local_48,ArrowCursor);
      QWidget::setCursor((QWidget *)CONCAT44(iVar2,in_stack_ffffffffffffff78),(QCursor *)in_RDI);
      QCursor::~QCursor(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::mouseDoubleClickEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    int handle = d->sectionHandleAt(pos);
    if (handle > -1 && sectionResizeMode(handle) == Interactive) {
        emit sectionHandleDoubleClicked(handle);
#ifndef QT_NO_CURSOR
        Qt::CursorShape splitCursor = (d->orientation == Qt::Horizontal)
                                      ? Qt::SplitHCursor : Qt::SplitVCursor;
        if (cursor().shape() == splitCursor) {
            // signal handlers may have changed the section size
            handle = d->sectionHandleAt(pos);
            if (!(handle > -1 && sectionResizeMode(handle) == Interactive))
                setCursor(Qt::ArrowCursor);
        }
#endif
    } else {
        emit sectionDoubleClicked(logicalIndexAt(e->position().toPoint()));
    }
}